

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_seed(Curl_easy *data)

{
  _Bool _Var1;
  undefined1 auVar2 [16];
  curltime cVar3;
  curltime cVar4;
  curltime cVar5;
  curltime cVar6;
  curltime cVar7;
  char *local_1c8;
  curltime tv;
  size_t i_max;
  size_t i;
  size_t len;
  uchar randb [64];
  char fname [256];
  Curl_easy *data_local;
  
  if (Curl_ossl_seed::ssl_seeded) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    _Var1 = rand_enough();
    if (_Var1) {
      Curl_ossl_seed::ssl_seeded = true;
      data_local._4_4_ = CURLE_OK;
    }
    else {
      if ((data->set).str[0x25] == (char *)0x0) {
        local_1c8 = "/dev/urandom";
      }
      else {
        local_1c8 = (data->set).str[0x25];
      }
      RAND_load_file(local_1c8,0x400);
      _Var1 = rand_enough();
      if (_Var1) {
        data_local._4_4_ = CURLE_OK;
      }
      else {
        do {
          for (i_max = 0; i_max < 4; i_max = i_max + 1) {
            cVar3 = Curl_now();
            Curl_wait_ms(1);
            cVar4 = Curl_now();
            cVar5 = Curl_now();
            cVar6 = Curl_now();
            cVar7 = Curl_now();
            *(size_t *)(randb + i_max * 0x10 + -8) =
                 (cVar4.tv_sec + (long)cVar5.tv_usec) * (i_max + 3) * 0x100 ^
                 (i_max + 1) * cVar3.tv_sec;
            *(ulong *)(randb + i_max * 0x10) =
                 CONCAT44(tv.tv_sec._4_4_,
                          ((int)cVar6.tv_sec + cVar7.tv_usec) * ((int)i_max + 4) * 0x10000 ^
                          ((int)i_max + 2) * cVar3.tv_usec);
          }
          auVar2._0_12_ = ZEXT812(0x40);
          auVar2._12_4_ = 0x45300000;
          RAND_add(&len,0x40,((auVar2._8_8_ - 1.9342813113834067e+25) + 64.0) / 2.0);
          _Var1 = rand_enough();
        } while (((_Var1 ^ 0xffU) & 1) != 0);
        randb[0x38] = '\0';
        RAND_file_name((char *)(randb + 0x38),0x100);
        if (randb[0x38] != '\0') {
          RAND_load_file((char *)(randb + 0x38),0x400);
          _Var1 = rand_enough();
          if (_Var1) {
            return CURLE_OK;
          }
        }
        Curl_infof(data,"libcurl is now using a weak random seed!\n");
        _Var1 = rand_enough();
        data_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
        if (_Var1) {
          data_local._4_4_ = CURLE_OK;
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode Curl_ossl_seed(struct Curl_easy *data)
{
  /* we have the "SSL is seeded" boolean static to prevent multiple
     time-consuming seedings in vain */
  static bool ssl_seeded = FALSE;
  char fname[256];

  if(ssl_seeded)
    return CURLE_OK;

  if(rand_enough()) {
    /* OpenSSL 1.1.0+ will return here */
    ssl_seeded = TRUE;
    return CURLE_OK;
  }

#ifndef RANDOM_FILE
  /* if RANDOM_FILE isn't defined, we only perform this if an option tells
     us to! */
  if(data->set.str[STRING_SSL_RANDOM_FILE])
#define RANDOM_FILE "" /* doesn't matter won't be used */
#endif
  {
    /* let the option override the define */
    RAND_load_file((data->set.str[STRING_SSL_RANDOM_FILE]?
                    data->set.str[STRING_SSL_RANDOM_FILE]:
                    RANDOM_FILE),
                   RAND_LOAD_LENGTH);
    if(rand_enough())
      return CURLE_OK;
  }

#if defined(HAVE_RAND_EGD)
  /* only available in OpenSSL 0.9.5 and later */
  /* EGD_SOCKET is set at configure time or not at all */
#ifndef EGD_SOCKET
  /* If we don't have the define set, we only do this if the egd-option
     is set */
  if(data->set.str[STRING_SSL_EGDSOCKET])
#define EGD_SOCKET "" /* doesn't matter won't be used */
#endif
  {
    /* If there's an option and a define, the option overrides the
       define */
    int ret = RAND_egd(data->set.str[STRING_SSL_EGDSOCKET]?
                       data->set.str[STRING_SSL_EGDSOCKET]:EGD_SOCKET);
    if(-1 != ret) {
      if(rand_enough())
        return CURLE_OK;
    }
  }
#endif

  /* fallback to a custom seeding of the PRNG using a hash based on a current
     time */
  do {
    unsigned char randb[64];
    size_t len = sizeof(randb);
    size_t i, i_max;
    for(i = 0, i_max = len / sizeof(struct curltime); i < i_max; ++i) {
      struct curltime tv = Curl_now();
      Curl_wait_ms(1);
      tv.tv_sec *= i + 1;
      tv.tv_usec *= (unsigned int)i + 2;
      tv.tv_sec ^= ((Curl_now().tv_sec + Curl_now().tv_usec) *
                    (i + 3)) << 8;
      tv.tv_usec ^= (unsigned int) ((Curl_now().tv_sec +
                                     Curl_now().tv_usec) *
                                    (i + 4)) << 16;
      memcpy(&randb[i * sizeof(struct curltime)], &tv,
             sizeof(struct curltime));
    }
    RAND_add(randb, (int)len, (double)len/2);
  } while(!rand_enough());

  /* generates a default path for the random seed file */
  fname[0] = 0; /* blank it first */
  RAND_file_name(fname, sizeof(fname));
  if(fname[0]) {
    /* we got a file name to try */
    RAND_load_file(fname, RAND_LOAD_LENGTH);
    if(rand_enough())
      return CURLE_OK;
  }

  infof(data, "libcurl is now using a weak random seed!\n");
  return (rand_enough() ? CURLE_OK :
    CURLE_SSL_CONNECT_ERROR /* confusing error code */);
}